

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O0

mcu8str * mctools_dirname(mcu8str *pathraw)

{
  char cVar1;
  mcu8str_size_t prealloc_size;
  mcu8str *in_RDI;
  bool bVar2;
  mcu8str *res;
  mcu8str_size_t ressize;
  char *it;
  char *it0;
  char *itE;
  char *itB;
  char drive_letter;
  mcu8str path;
  mcu8str *rawpath;
  char *in_stack_ffffffffffffffb0;
  char *local_48;
  char *local_30;
  char *local_20;
  uint local_18;
  
  rawpath = in_RDI;
  mctools_impl_view_no_winnamespace(in_RDI);
  cVar1 = mctools_drive_letter(rawpath);
  local_30 = local_20;
  local_48 = local_20 + local_18;
  if (cVar1 != '\0') {
    local_30 = local_20 + 2;
  }
  if (local_30 == local_48) {
    if (cVar1 == '\0') {
      mcu8str_create_empty();
    }
    else {
      mcu8str_create_from_cstr(in_stack_ffffffffffffffb0);
      *in_RDI->c_str = cVar1;
    }
  }
  else {
    do {
      local_48 = local_48 + -1;
      bVar2 = false;
      if ((local_30 < local_48) && (bVar2 = false, *local_48 != '/')) {
        bVar2 = *local_48 != '\\';
      }
    } while (bVar2);
    while( true ) {
      bVar2 = false;
      if ((local_30 < local_48) && (bVar2 = true, local_48[-1] != '/')) {
        bVar2 = local_48[-1] == '\\';
      }
      if (!bVar2) break;
      local_48 = local_48 + -1;
    }
    if ((local_48 == local_30) && ((*local_48 == '/' || (*local_48 == '\\')))) {
      local_48 = local_48 + 1;
    }
    prealloc_size = (long)local_48 - (long)local_30;
    if ((prealloc_size == 1) && (*local_30 == '.')) {
      if (cVar1 == '\0') {
        mcu8str_create_from_cstr((char *)0x1);
      }
      else {
        mcu8str_create_from_cstr((char *)0x1);
        *in_RDI->c_str = cVar1;
      }
    }
    else if (prealloc_size == 0) {
      if ((*local_20 == '.') && (cVar1 == '\0')) {
        mcu8str_create_from_cstr((char *)0x0);
      }
      else if (cVar1 == '\0') {
        mcu8str_create_empty();
      }
      else {
        mcu8str_create_from_cstr((char *)0x0);
        *in_RDI->c_str = cVar1;
      }
    }
    else if (cVar1 == '\0') {
      mcu8str_create(prealloc_size);
      memcpy(in_RDI->c_str,local_30,prealloc_size);
      in_RDI->c_str[prealloc_size] = '\0';
      in_RDI->size = (uint)prealloc_size;
      mctools_pathseps_platform(in_RDI);
    }
    else {
      mcu8str_create(prealloc_size);
      *in_RDI->c_str = cVar1;
      in_RDI->c_str[1] = ':';
      memcpy(in_RDI->c_str + 2,local_30,prealloc_size);
      in_RDI->c_str[prealloc_size + 2] = '\0';
      in_RDI->size = (int)prealloc_size + 2;
      mctools_pathseps_platform(in_RDI);
    }
  }
  return rawpath;
}

Assistant:

mcu8str mctools_dirname( const mcu8str* pathraw )
  {
    mcu8str path = mctools_impl_view_no_winnamespace(pathraw);
    char drive_letter = mctools_drive_letter( &path );
    const char * itB = path.c_str;
    const char * itE = path.c_str + path.size;
    if ( drive_letter )
      itB += 2;//ignore drive letter while analysing

    if ( itB == itE ) {
      //empty:
      if ( drive_letter ) {
        mcu8str res = mcu8str_create_from_cstr("::");
        res.c_str[0] = drive_letter;
        return res;
      } else {
        return mcu8str_create_empty();
      }
    }

    //Find last path sep, skipping consecutive separatorss:
    const char * it0 = itB;
    //const char * itB = ( drive_letter ? it0 + 2 : it0 );
    const char * it = (itE-1);//start at last

    while ( it > itB && *it!='/' && *it!='\\' )
      --it;
    //it is now at the last path sep:
    while ( it > itB && ( *(it-1)=='/' || *(it-1)=='\\' ) )
      --it;

    //If this turned a path starting with a path sep into an empty path, add
    //back a single slash (so that dirname("/")="/" and not ""):
    if ( it == itB && ( *it == '/' || *it == '\\' ) )
      ++it;

    //Apart from a potential drive_letter, the string at [it0,it) is now the
    //result:
    mcu8str_size_t ressize = (mcu8str_size_t)(it-it0);

    if ( ressize == 1 && *it0 == '.' ) {
      //special case, "." or "D:."
      if ( drive_letter ) {
        mcu8str res = mcu8str_create_from_cstr("::");
        res.c_str[0] = drive_letter;
        return res;
      } else {
        return mcu8str_create_from_cstr(".");
      }
    }

    if ( ressize == 0 ) {
      if ( path.c_str[0] == '.' && !drive_letter )
        return mcu8str_create_from_cstr(".");
      if ( drive_letter ) {
        mcu8str res = mcu8str_create_from_cstr("::");
        res.c_str[0] = drive_letter;
        return res;
      } else {
        return mcu8str_create_empty();
      }
    }
    if ( drive_letter ) {
      mcu8str res = mcu8str_create( ressize + 2 );
      res.c_str[0] = drive_letter;
      res.c_str[1] = ':';
      STDNS memcpy( res.c_str + 2, it0, ressize );
      res.c_str[ressize+2] = '\0';
      res.size = (unsigned)ressize+2;//cast ok, checked by mcu8str_create
      mctools_pathseps_platform(&res);
      return res;
    } else {
      mcu8str res = mcu8str_create( ressize );
      STDNS memcpy( res.c_str, it0, ressize );
      res.c_str[ressize] = '\0';
      res.size = (unsigned)ressize;//cast ok, checked by mcu8str_create
      mctools_pathseps_platform(&res);
      return res;
    }
  }